

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O2

void __thiscall
cm::uv_handle_ptr_base_<uv_timer_s>::allocate(uv_handle_ptr_base_<uv_timer_s> *this,void *data)

{
  void *pvVar1;
  
  std::__shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2> *)this);
  pvVar1 = calloc(1,0x98);
  std::__shared_ptr<uv_timer_s,(__gnu_cxx::_Lock_policy)2>::
  reset<uv_timer_s,cm::uv_handle_deleter<uv_timer_s>>
            ((__shared_ptr<uv_timer_s,(__gnu_cxx::_Lock_policy)2> *)this,pvVar1);
  ((this->handle).super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data = data;
  return;
}

Assistant:

void uv_handle_ptr_base_<T>::allocate(void* data)
{
  this->reset();

  /*
    We use calloc since we know all these types are c structs
    and we just want to 0 init them. New would do the same thing;
    but casting from uv_handle_t to certain other types -- namely
    uv_timer_t -- triggers a cast_align warning on certain systems.
  */
  this->handle.reset(static_cast<T*>(calloc(1, sizeof(T))),
                     uv_handle_deleter<T>());
  this->handle->data = data;
}